

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

void __thiscall FString::ToUpper(FString *this)

{
  int iVar1;
  size_t sVar2;
  ulong local_20;
  size_t i;
  size_t max;
  FString *this_local;
  
  LockBuffer(this);
  sVar2 = Len(this);
  for (local_20 = 0; local_20 < sVar2; local_20 = local_20 + 1) {
    iVar1 = toupper((int)this->Chars[local_20]);
    this->Chars[local_20] = (char)iVar1;
  }
  UnlockBuffer(this);
  return;
}

Assistant:

void FString::ToUpper ()
{
	LockBuffer();
	size_t max = Len();
	for (size_t i = 0; i < max; ++i)
	{
		Chars[i] = (char)toupper(Chars[i]);
	}
	UnlockBuffer();
}